

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Task *pTVar1;
  Disposer *pDVar2;
  Task *pTVar3;
  Own<kj::TaskSet::Task> task;
  Disposer *local_18;
  Task *local_10;
  
  heap<kj::TaskSet::Task,kj::TaskSet&,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_18,this,(Own<kj::_::PromiseNode> *)promise);
  pTVar1 = (this->tasks).ptr.ptr;
  if (pTVar1 != (Task *)0x0) {
    ((this->tasks).ptr.ptr)->prev = &local_10->next;
    pDVar2 = (local_10->next).ptr.disposer;
    pTVar3 = (local_10->next).ptr.ptr;
    (local_10->next).ptr.disposer = (this->tasks).ptr.disposer;
    (local_10->next).ptr.ptr = pTVar1;
    (this->tasks).ptr.ptr = (Task *)0x0;
    if (pTVar3 != (Task *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&(pTVar3->super_Event)._vptr_Event +
                        (long)(pTVar3->super_Event)._vptr_Event[-2]));
    }
  }
  pTVar3 = local_10;
  local_10->prev = &this->tasks;
  local_10 = (Task *)0x0;
  pDVar2 = (this->tasks).ptr.disposer;
  pTVar1 = (this->tasks).ptr.ptr;
  (this->tasks).ptr.disposer = local_18;
  (this->tasks).ptr.ptr = pTVar3;
  if (pTVar1 != (Task *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pTVar1->super_Event)._vptr_Event +
                      (long)(pTVar1->super_Event)._vptr_Event[-2]));
  }
  pTVar1 = local_10;
  if (local_10 != (Task *)0x0) {
    local_10 = (Task *)0x0;
    (**local_18->_vptr_Disposer)(local_18,(long)pTVar1 + *(long *)(*(long *)pTVar1 + -0x10));
  }
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = heap<Task>(*this, kj::mv(promise.node));
  KJ_IF_MAYBE(head, tasks) {
    head->get()->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}